

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qnetworkrequest.cpp
# Opt level: O3

void __thiscall QNetworkRequest::setPriority(QNetworkRequest *this,Priority priority)

{
  QNetworkRequestPrivate *pQVar1;
  
  pQVar1 = (this->d).d.ptr;
  if ((__atomic_base<int>)
      *(__int_type *)
       &(pQVar1->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
        _q_value != (__atomic_base<int>)0x1) {
    QSharedDataPointer<QNetworkRequestPrivate>::detach_helper(&this->d);
    pQVar1 = (this->d).d.ptr;
  }
  pQVar1->priority = priority;
  return;
}

Assistant:

void QNetworkRequest::setPriority(Priority priority)
{
    d->priority = priority;
}